

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucase.cpp
# Opt level: O3

UBool ucase_isCaseSensitive_63(UChar32 c)

{
  ushort uVar1;
  byte bVar2;
  uint uVar3;
  ulong uVar4;
  
  if ((uint)c < 0xd800) {
    uVar3 = (uint)c >> 5;
  }
  else if ((uint)c < 0x10000) {
    uVar3 = ((uint)c >> 5) + 0x140;
    if (0xdbff < (uint)c) {
      uVar3 = (uint)c >> 5;
    }
  }
  else {
    uVar4 = 0xd30;
    if ((0x10ffff < (uint)c) || (uVar4 = 0x2f1c, 0xe07ff < (uint)c)) goto LAB_002a988d;
    uVar3 = ((uint)c >> 5 & 0x3f) + (uint)ucase_props_trieIndex[(ulong)((uint)c >> 0xb) + 0x820];
  }
  uVar4 = (ulong)((c & 0x1fU) + (uint)ucase_props_trieIndex[uVar3] * 4);
LAB_002a988d:
  uVar1 = ucase_props_trieIndex[uVar4];
  if ((uVar1 & 8) == 0) {
    bVar2 = (byte)uVar1 >> 4;
  }
  else {
    bVar2 = (byte)(ucase_props_exceptions[uVar1 >> 4] >> 0xb);
  }
  return bVar2 & 1;
}

Assistant:

U_CAPI UBool U_EXPORT2
ucase_isCaseSensitive(UChar32 c) {
    uint16_t props=UTRIE2_GET16(&ucase_props_singleton.trie, c);
    if(!UCASE_HAS_EXCEPTION(props)) {
        return (UBool)((props&UCASE_SENSITIVE)!=0);
    } else {
        const uint16_t *pe=GET_EXCEPTIONS(&ucase_props_singleton, props);
        return (UBool)((*pe&UCASE_EXC_SENSITIVE)!=0);
    }
}